

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbannouncer.cpp
# Opt level: O3

bool AnnounceTelefrag(AActor *killer,AActor *killee)

{
  Node *pNVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint uVar4;
  char *from;
  Node *pNVar5;
  Node *pNVar6;
  uint uVar7;
  undefined8 *puVar8;
  bool bVar9;
  char assembled [1024];
  char acStack_428 [1024];
  
  uVar4 = FRandom::GenRand32(&pr_bbannounce);
  if ((cl_bbannounce.Value == true) && (multiplayer == true)) {
    from = FStringTable::operator()(&GStrings,"OB_MPTELEFRAG");
    bVar9 = from != (char *)0x0;
    if (bVar9) {
      pNVar1 = (killee->player->userinfo).
               super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
      uVar7 = (killee->player->userinfo).
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size -
              1;
      pNVar5 = pNVar1 + (uVar7 & 0x209);
      do {
        pNVar6 = pNVar5;
        pNVar5 = pNVar6->Next;
      } while ((pNVar6->Pair).Key.Index != 0x209);
      pNVar1 = pNVar1 + (uVar7 & 0x1ea);
      do {
        pNVar5 = pNVar1;
        pNVar1 = pNVar5->Next;
      } while ((pNVar5->Pair).Key.Index != 0x1ea);
      puVar2 = (undefined8 *)
               ((long)&((killer->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((killer->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x1ea) * 0x18));
      do {
        puVar8 = puVar2;
        puVar2 = (undefined8 *)*puVar8;
      } while (*(int *)(puVar8 + 1) != 0x1ea);
      SexMessage(from,acStack_428,*(int *)&(pNVar6->Pair).Value[1]._vptr_FBaseCVar,
                 (char *)(pNVar5->Pair).Value[1]._vptr_FBaseCVar,*(char **)(puVar8[2] + 0x28));
      Printf(1,"%s\n",acStack_428);
    }
    bVar3 = AActor::CheckLocalView(killee,consoleplayer);
    if ((!bVar3) && (bVar3 = AActor::CheckLocalView(killer,consoleplayer), !bVar3)) {
      return bVar9;
    }
    uVar4 = uVar4 & 0xff;
    DoVoiceAnnounce(_ZL14TelefragSounds_rel +
                    *(int *)(_ZL14TelefragSounds_rel +
                            (ulong)(uVar4 / 7 + (uVar4 / 7) * -8 + uVar4) * 4));
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool AnnounceTelefrag (AActor *killer, AActor *killee)
{
	int rannum = pr_bbannounce();

	if (cl_bbannounce && multiplayer)
	{
		const char *message = GStrings("OB_MPTELEFRAG");
		if (message != NULL)
		{
			char assembled[1024];

			SexMessage (message, assembled, killee->player->userinfo.GetGender(),
				killee->player->userinfo.GetName(), killer->player->userinfo.GetName());
			Printf (PRINT_MEDIUM, "%s\n", assembled);
		}
		if (killee->CheckLocalView (consoleplayer) ||
			killer->CheckLocalView (consoleplayer))
		{
			DoVoiceAnnounce (TelefragSounds[rannum % 7]);
		}
		return message != NULL;
	}
	return false;
}